

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCDPP_MPI.h
# Opt level: O0

value_type_conflict1 __thiscall
CCDPP_MPI::predict(CCDPP_MPI *this,vector<Rating,_std::allocator<Rating>_> *ratings)

{
  bool bVar1;
  size_type sVar2;
  reference pdVar3;
  vector<Rating,_std::allocator<Rating>_> *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  int iVar4;
  value_type_conflict1 global_rmse;
  value_type_conflict1 rmse;
  iterator __end1;
  iterator __begin1;
  vector<double,_std::allocator<double>_> *__range1;
  value_type_conflict1 result;
  int thread_index;
  vector<double,_std::allocator<double>_> rmses;
  int workload;
  int size;
  thread_pool<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
  *in_stack_fffffffffffffed0;
  allocator_type *in_stack_fffffffffffffed8;
  task_type *task;
  task_type *this_00;
  undefined *__n;
  undefined1 *puVar5;
  _Bind<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Hui_Li[P]CCDPP_alg_CCDPP_MPI_h:184:45)_(int)>
  *in_stack_ffffffffffffff08;
  function0<void> *in_stack_ffffffffffffff10;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_e0;
  undefined1 *local_d8;
  double local_d0;
  int *local_c8;
  int *local_c0;
  vector<Rating,_std::allocator<Rating>_> *local_b8;
  undefined1 *local_a8;
  int local_50;
  undefined1 local_39;
  undefined8 local_38;
  undefined1 local_30 [24];
  int local_18;
  int local_14;
  vector<Rating,_std::allocator<Rating>_> *local_10;
  
  iVar4 = *(int *)in_RDI[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish *
          *(int *)&in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
  task = (task_type *)&ompi_mpi_comm_world;
  __n = &ompi_mpi_double;
  local_10 = in_RSI;
  MPI_Allgather(in_RDI[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,iVar4,&ompi_mpi_double,
                in_RDI[10].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start,iVar4,&ompi_mpi_double,&ompi_mpi_comm_world);
  this_00 = task;
  MPI_Allgather(in_RDI[3].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start,
                *(int *)in_RDI[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish *
                *(int *)((long)&in_RDI[1].super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start + 4),__n,
                in_RDI[10].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish);
  sVar2 = std::vector<Rating,_std::allocator<Rating>_>::size(local_10);
  local_14 = (int)sVar2;
  iVar4 = *(int *)((long)in_RDI[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish + 0x24);
  local_18 = (local_14 / iVar4 + 1) - (uint)(local_14 % iVar4 == 0);
  local_38 = 0;
  puVar5 = &local_39;
  std::allocator<double>::allocator((allocator<double> *)0x19a8e8);
  std::vector<double,_std::allocator<double>_>::vector
            (in_RDI,(size_type)__n,(value_type_conflict1 *)this_00,in_stack_fffffffffffffed8);
  std::allocator<double>::~allocator((allocator<double> *)0x19a916);
  for (local_50 = 0;
      local_50 <
      *(int *)((long)in_RDI[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish + 0x24); local_50 = local_50 + 1) {
    local_c8 = &local_18;
    local_c0 = &local_14;
    local_b8 = local_10;
    local_a8 = local_30;
    std::bind<CCDPP_MPI::predict(std::vector<Rating,std::allocator<Rating>>&)::_lambda(int)_1_,int&>
              ((anon_class_40_5_790dea82_for__M_f *)
               (in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start,(int *)in_stack_fffffffffffffed0);
    boost::function0<void>::
    function0<std::_Bind<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Hui_Li[P]CCDPP_alg_CCDPP_MPI_h:184:45)_(int)>_>
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,(type)((ulong)puVar5 >> 0x20));
    boost::threadpool::
    thread_pool<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
    ::schedule(in_stack_fffffffffffffed0,task);
    boost::function0<void>::~function0((function0<void> *)0x19a9df);
  }
  boost::threadpool::
  thread_pool<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
  ::wait((thread_pool<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
          *)(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start,(void *)0x0);
  local_d0 = 0.0;
  local_d8 = local_30;
  local_e0._M_current =
       (double *)
       std::vector<double,_std::allocator<double>_>::begin
                 ((vector<double,_std::allocator<double>_> *)task);
  std::vector<double,_std::allocator<double>_>::end((vector<double,_std::allocator<double>_> *)task)
  ;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *
                       )in_stack_fffffffffffffed0,
                       (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *
                       )task);
    if (!bVar1) break;
    pdVar3 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&local_e0);
    local_d0 = *pdVar3 + local_d0;
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&local_e0);
  }
  MPI_Allreduce(&local_d0,&stack0xffffffffffffff08,1,&ompi_mpi_double,&ompi_mpi_op_sum,
                &ompi_mpi_comm_world);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)this_00);
  return (value_type_conflict1)in_stack_ffffffffffffff08;
}

Assistant:

value_type predict(vector<Rating> &ratings) {

        // For prediction, you need Q and P, thus Q and P needs to be communicated.
        MPI_Allgather(Q, parameter->k * Q_workload, VALUE_MPI_TYPE, entire_Q, parameter->k * Q_workload, VALUE_MPI_TYPE, MPI_COMM_WORLD);
        MPI_Allgather(P, parameter->k * P_workload, VALUE_MPI_TYPE, entire_P, parameter->k * P_workload, VALUE_MPI_TYPE, MPI_COMM_WORLD);

        int size = ratings.size();
        int workload = size / parameter->num_of_thread + ((size % parameter->num_of_thread == 0) ? 0 : 1);

        vector<value_type> rmses(parameter->num_of_thread, 0);

        for(int thread_index=0;thread_index<parameter->num_of_thread;thread_index++){
            thread_pool->schedule(std::bind([&](const int thread_index) {
                int start = workload * thread_index;
                int end = std::min(start + workload, size);

                for (int i = start; i < end; i++) {

                    Rating &rating = ratings[i];

                    value_type prediction = 0;
                    for (int d = 0; d < parameter->k; d++) {
                        prediction += entire_Q[d * Q_workload * num_of_machines + rating.user_id] * entire_P[d * P_workload * num_of_machines + rating.item_id];
                    }

                    value_type error = rating.score - prediction;
                    rmses[thread_index] += error * error;
                }
            }, thread_index));
        }

        thread_pool->wait();

        value_type result = 0;

        for (value_type rmse:rmses) {
            result += rmse;
        }

        value_type global_rmse;
        MPI_Allreduce(&result, &global_rmse, 1, VALUE_MPI_TYPE, MPI_SUM, MPI_COMM_WORLD);

        return global_rmse;
    }